

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_for_each.cpp
# Opt level: O2

void stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  GuidedPartitioner<tf::DefaultClosureWrapper> part;
  char extraout_AL;
  char extraout_AL_00;
  char extraout_AL_01;
  long lVar3;
  Executor *this;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined1 in_stack_fffffffffffffc88 [12];
  int in_stack_fffffffffffffc94;
  Expression_lhs<const_std::atomic<int>_&> local_368;
  long local_358;
  ulong local_350;
  atomic<int> counter;
  ResultBuilder DOCTEST_RB;
  vector<int,_std::allocator<int>_> vec;
  Task pf2;
  Task pf1;
  size_t half;
  size_t iend;
  size_t ibeg;
  iterator end;
  iterator beg;
  Task init;
  Node *local_268;
  String local_260;
  shared_ptr<tf::WorkerInterface> local_248;
  Taskflow taskflow;
  Executor executor;
  
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_248);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_248.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  counter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_350 = 0;
  do {
    if (0x96 < local_350) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vec.super__Vector_base<int,_std::allocator<int>_>);
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    lVar3 = 0;
    while( true ) {
      if (lVar3 == 0x14) break;
      beg._M_current = (int *)0x0;
      end._M_current = (int *)0x0;
      ibeg = 0;
      iend = 0;
      local_358 = (long)*(int *)((long)&DAT_001492b8 + lVar3);
      half = local_350 >> 1;
      std::
      vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
      ::clear(&taskflow._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             );
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&vec;
      DOCTEST_RB.super_AssertData._8_8_ = &local_350;
      DOCTEST_RB.super_AssertData._24_8_ = &end;
      DOCTEST_RB.super_AssertData.m_expr = (char *)&half;
      DOCTEST_RB.super_AssertData._40_8_ = &ibeg;
      DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr = (char *)&iend;
      DOCTEST_RB.super_AssertData.m_file = (char *)&beg;
      DOCTEST_RB.super_AssertData.m_exception.field_0._8_8_ = &counter;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_for_each_cpp:295:36),_nullptr>
                ((FlowBuilder *)&init,(anon_class_64_8_523e6f90 *)&taskflow);
      lVar5 = local_358;
      pf1._node = (Node *)0x0;
      pf2._node = (Node *)0x0;
      part.super_PartitionerBase<tf::DefaultClosureWrapper>._12_4_ = in_stack_fffffffffffffc94;
      part.super_PartitionerBase<tf::DefaultClosureWrapper>._0_12_ = in_stack_fffffffffffffc88;
      tf::FlowBuilder::
      for_each<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,stateful_for_each<tf::GuidedPartitioner<tf::DefaultClosureWrapper>>(unsigned_int)::_lambda(int&)_1_,tf::GuidedPartitioner<tf::DefaultClosureWrapper>>
                ((FlowBuilder *)&DOCTEST_RB.super_AssertData,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&taskflow,&beg
                 ,(atomic<int> *)&end,part);
      pf1._node = (Node *)DOCTEST_RB.super_AssertData.m_test_case;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&ibeg;
      DOCTEST_RB.super_AssertData._8_8_ = &iend;
      DOCTEST_RB.super_AssertData.m_file = (char *)0x1;
      DOCTEST_RB.super_AssertData._24_8_ = lVar5;
      DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr = (char *)&vec;
      DOCTEST_RB.super_AssertData._40_8_ = &counter;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_for_each_hpp:84:10),_nullptr>
                ((FlowBuilder *)&local_268,(anon_class_56_5_086014e6 *)&taskflow);
      pf2._node = local_268;
      tf::Task::precede<tf::Task&,tf::Task&>(&init,&pf1,&pf2);
      this = &executor;
      tf::Executor::run((Future<void> *)&DOCTEST_RB.super_AssertData,this,&taskflow);
      std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB.super_AssertData,this);
      tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB.super_AssertData);
      DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr =
           (char *)((ulong)DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr &
                   0xffffffffffffff00);
      DOCTEST_RB.super_AssertData._71_2_ = 0x17;
      DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
      DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
      local_368.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
      DOCTEST_RB.super_AssertData.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
      ;
      DOCTEST_RB.super_AssertData.m_line = 0x145;
      DOCTEST_RB.super_AssertData.m_expr = "counter == n";
      DOCTEST_RB.super_AssertData.m_failed = true;
      DOCTEST_RB.super_AssertData.m_threw = false;
      DOCTEST_RB.super_AssertData.m_threw_as = false;
      DOCTEST_RB.super_AssertData.m_exception_type = "";
      DOCTEST_RB.super_AssertData.m_exception_string = "";
      local_368.lhs = &counter;
      doctest::detail::Expression_lhs<const_std::atomic<int>_&>::operator==<unsigned_long,_nullptr>
                ((Result *)&local_268,&local_368,&local_350);
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&local_268);
      doctest::String::~String(&local_260);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if (extraout_AL != '\0') {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
      doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
      lVar5 = 0;
      for (uVar6 = 0; uVar6 < half; uVar6 = uVar6 + 1) {
        DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr =
             (char *)((ulong)DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr &
                     0xffffffffffffff00);
        DOCTEST_RB.super_AssertData._71_2_ = 0x17;
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_368.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x148;
        DOCTEST_RB.super_AssertData.m_expr = "vec[i] == 8";
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_368.lhs =
             (atomic<int> *)
             ((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar5);
        in_stack_fffffffffffffc94 = 8;
        doctest::detail::Expression_lhs<int_const&>::operator==
                  ((Result *)&local_268,(Expression_lhs<int_const&> *)&local_368,
                   (int *)&stack0xfffffffffffffc94);
        doctest::detail::ResultBuilder::setResult
                  ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&local_268);
        doctest::String::~String(&local_260);
        dVar2 = doctest::detail::ResultBuilder::log
                          ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
        if (extraout_AL_00 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
        doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
        *(undefined4 *)
         ((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + lVar5) = 0;
        lVar5 = lVar5 + 4;
      }
      lVar5 = half * 4;
      for (sVar4 = half; sVar4 < local_350; sVar4 = sVar4 + 1) {
        DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr =
             (char *)((ulong)DOCTEST_RB.super_AssertData.m_exception.field_0.data.ptr &
                     0xffffffffffffff00);
        DOCTEST_RB.super_AssertData._71_2_ = 0x17;
        DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
        DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
        local_368.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
        DOCTEST_RB.super_AssertData.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_for_each.cpp"
        ;
        DOCTEST_RB.super_AssertData.m_line = 0x14d;
        DOCTEST_RB.super_AssertData.m_expr = "vec[i] == -8";
        DOCTEST_RB.super_AssertData.m_failed = true;
        DOCTEST_RB.super_AssertData.m_threw = false;
        DOCTEST_RB.super_AssertData.m_threw_as = false;
        DOCTEST_RB.super_AssertData.m_exception_type = "";
        DOCTEST_RB.super_AssertData.m_exception_string = "";
        local_368.lhs =
             (atomic<int> *)
             ((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar5);
        in_stack_fffffffffffffc94 = -8;
        doctest::detail::Expression_lhs<int_const&>::operator==
                  ((Result *)&local_268,(Expression_lhs<int_const&> *)&local_368,
                   (int *)&stack0xfffffffffffffc94);
        doctest::detail::ResultBuilder::setResult
                  ((ResultBuilder *)&DOCTEST_RB.super_AssertData,(Result *)&local_268);
        doctest::String::~String(&local_260);
        dVar2 = doctest::detail::ResultBuilder::log
                          ((ResultBuilder *)&DOCTEST_RB.super_AssertData,
                           (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
        if (extraout_AL_01 != '\0') {
          pcVar1 = (code *)swi(3);
          (*pcVar1)(SUB84(dVar2,0));
          return;
        }
        doctest::detail::ResultBuilder::react((ResultBuilder *)&DOCTEST_RB.super_AssertData);
        doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
        *(undefined4 *)
         ((long)vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + lVar5) = 0;
        lVar5 = lVar5 + 4;
      }
      lVar3 = lVar3 + 4;
    }
    local_350 = local_350 + 1;
  } while( true );
}

Assistant:

void stateful_for_each(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;
  std::vector<int> vec;
  std::atomic<int> counter {0};

  for(size_t n = 0; n <= 150; n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      std::vector<int>::iterator beg, end;
      size_t ibeg = 0, iend = 0;
      size_t half = n/2;

      taskflow.clear();

      auto init = taskflow.emplace([&](){
        vec.resize(n);
        std::fill_n(vec.begin(), vec.size(), -1);

        beg = vec.begin();
        end = beg + half;

        ibeg = half;
        iend = n;

        counter = 0;
      });

      tf::Task pf1, pf2;

      pf1 = taskflow.for_each(
        std::ref(beg), std::ref(end), [&](int& i){
        counter++;
        i = 8;
      }, P(c));

      pf2 = taskflow.for_each_index(
        std::ref(ibeg), std::ref(iend), size_t{1}, [&] (size_t i) {
          counter++;
          vec[i] = -8;
      }, P(c));

      init.precede(pf1, pf2);

      executor.run(taskflow).wait();
      REQUIRE(counter == n);

      for(size_t i=0; i<half; ++i) {
        REQUIRE(vec[i] == 8);
        vec[i] = 0;
      }

      for(size_t i=half; i<n; ++i) {
        REQUIRE(vec[i] == -8);
        vec[i] = 0;
      }
    }
  }
}